

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_cycler.cpp
# Opt level: O1

void __thiscall FCycler::Serialize(FCycler *this,FArchive *arc)

{
  undefined8 in_RAX;
  FArchive *pFVar1;
  BYTE val;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  pFVar1 = FArchive::operator<<(arc,&this->m_start);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_end);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_current);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_time);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_cycle);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_increment);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_shouldCycle);
  uStack_18._7_1_ = (char)this->m_cycleType;
  FArchive::operator<<(pFVar1,(BYTE *)((long)&uStack_18 + 7));
  this->m_cycleType = (uint)(byte)uStack_18._7_1_;
  return;
}

Assistant:

void FCycler::Serialize(FArchive & arc)
{
	arc << m_start << m_end << m_current 
		<< m_time << m_cycle << m_increment << m_shouldCycle
		<< m_cycleType;
}